

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O2

int GetDefaultLocaleMask(TCascStorage *hs,PQUERY_KEY pTagsString)

{
  byte bVar1;
  long lVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar6 = pTagsString->pbData;
  pbVar7 = pbVar6 + pTagsString->cbData;
  uVar4 = 0;
LAB_00112bee:
  pbVar6 = pbVar6 + 4;
  do {
    if (pbVar7 <= pbVar6 + -4) {
      hs->dwDefaultLocale = uVar4;
      return in_EAX;
    }
    if (pbVar6 <= pbVar7) {
      bVar1 = *pbVar6;
      in_EAX = (uint)bVar1;
      if ((bVar1 == 0x2c) || (bVar1 == 0x20)) break;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (lVar5 + 0x10 == 0x100) {
      in_EAX = 0;
      goto LAB_00112c4c;
    }
    iVar3 = strncmp(*(char **)((long)&LocaleStrings[0].szLocale + lVar5),(char *)(pbVar6 + -4),4);
    lVar2 = lVar5 + 0x10;
  } while (iVar3 != 0);
  in_EAX = *(uint *)((long)&LocaleStrings[0].dwLocale + lVar5);
LAB_00112c4c:
  uVar4 = uVar4 | in_EAX;
  goto LAB_00112bee;
}

Assistant:

static int GetDefaultLocaleMask(TCascStorage * hs, PQUERY_KEY pTagsString)
{
    char * szTagEnd = (char *)pTagsString->pbData + pTagsString->cbData;
    char * szTagPtr = (char *)pTagsString->pbData;
    DWORD dwLocaleMask = 0;

    while(szTagPtr < szTagEnd)
    {
        // Could this be a locale string?
        if((szTagPtr + 4) <= szTagEnd && (szTagPtr[4] == ',' ||  szTagPtr[4] == ' '))
        {
            // Check whether the current tag is a language identifier
            dwLocaleMask = dwLocaleMask | GetLocaleMask(szTagPtr);
            szTagPtr += 4;
        }
        else
        {
            szTagPtr++;
        }
    }

    hs->dwDefaultLocale = dwLocaleMask;
    return ERROR_SUCCESS;
}